

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,string *filename)

{
  pointer *this_00;
  bool bVar1;
  string *in_base;
  char *filename_00;
  cmMessenger *messenger;
  element_type *peVar2;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [24];
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  cmListFile listFile;
  undefined1 local_70 [40];
  ListFileScope scope;
  string filenametoread;
  string *filename_local;
  cmMakefile *this_local;
  
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath((string *)&scope.ReportError,filename,in_base);
  ListFileScope::ListFileScope((ListFileScope *)(local_70 + 0x20),this,(string *)&scope.ReportError)
  ;
  GetCMakeInstance(this);
  cmake::GetDebugAdapter((cmake *)local_70);
  bVar1 = std::operator!=((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_70,(nullptr_t)0x0);
  std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
            ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_70);
  if (bVar1) {
    GetCMakeInstance(this);
    this_00 = &listFile.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    cmake::GetDebugAdapter((cmake *)this_00);
    peVar2 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
    cmDebugger::cmDebuggerAdapter::OnBeginFileParse(peVar2,this,(string *)&scope.ReportError);
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)
               &listFile.Functions.
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  cmListFile::cmListFile((cmListFile *)(local_a8 + 0x10));
  filename_00 = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile
                    ((cmListFile *)(local_a8 + 0x10),filename_00,messenger,&this->Backtrace);
  if (bVar1) {
    GetCMakeInstance(this);
    cmake::GetDebugAdapter((cmake *)local_d0);
    bVar1 = std::operator!=((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_d0,(nullptr_t)0x0);
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_d0);
    if (bVar1) {
      GetCMakeInstance(this);
      cmake::GetDebugAdapter((cmake *)local_e0);
      peVar2 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e0);
      cmDebugger::cmDebuggerAdapter::OnEndFileParse(peVar2);
      std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_e0);
      GetCMakeInstance(this);
      cmake::GetDebugAdapter((cmake *)local_f0);
      peVar2 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f0);
      cmDebugger::cmDebuggerAdapter::OnFileParsedSuccessfully
                (peVar2,(string *)&scope.ReportError,
                 (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                 (local_a8 + 0x10));
      std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_f0);
    }
    RunListFile(this,(cmListFile *)(local_a8 + 0x10),(string *)&scope.ReportError,
                (DeferCommands *)0x0);
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      ListFileScope::Quiet((ListFileScope *)(local_70 + 0x20));
    }
    this_local._7_1_ = true;
  }
  else {
    GetCMakeInstance(this);
    cmake::GetDebugAdapter((cmake *)local_a8);
    bVar1 = std::operator!=((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_a8,(nullptr_t)0x0);
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_a8);
    if (bVar1) {
      GetCMakeInstance(this);
      cmake::GetDebugAdapter((cmake *)local_b8);
      peVar2 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b8);
      cmDebugger::cmDebuggerAdapter::OnEndFileParse(peVar2);
      std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_b8);
    }
    this_local._7_1_ = false;
  }
  local_d0._20_4_ = 1;
  cmListFile::~cmListFile((cmListFile *)(local_a8 + 0x10));
  ListFileScope::~ListFileScope((ListFileScope *)(local_70 + 0x20));
  std::__cxx11::string::~string((string *)&scope.ReportError);
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ReadListFile(const std::string& filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnBeginFileParse(
      this, filenametoread);
  }
#endif

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
#ifdef CMake_ENABLE_DEBUGGER
    if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
      this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    }
#endif

    return false;
  }

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    this->GetCMakeInstance()->GetDebugAdapter()->OnFileParsedSuccessfully(
      filenametoread, listFile.Functions);
  }
#endif

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }
  return true;
}